

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O0

void __thiscall level_tools::level_tools(level_tools *this)

{
  level_tools *this_local;
  
  tools_base::tools_base(&this->super_tools_base);
  xray_re::xr_surface_factory::xr_surface_factory(&this->super_xr_surface_factory);
  (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__level_tools_00389120;
  (this->super_xr_surface_factory)._vptr_xr_surface_factory =
       (_func_int **)&PTR__level_tools_00389150;
  this->m_ini = (xr_ini_file *)0x0;
  this->m_shaders_xrlc_lib = (xr_shaders_xrlc_lib *)0x0;
  this->m_level = (xr_level *)0x0;
  this->m_scene = (xr_scene *)0x0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_uniq_textures);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_uniq_shaders);
  std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::vector(&this->m_mu_models);
  std::__cxx11::string::string((string *)&this->m_objects_ref);
  this->m_sg_val = (char *)0x0;
  this->m_sg_type = SOC;
  return;
}

Assistant:

level_tools::level_tools():
	m_ini(0),
	m_shaders_xrlc_lib(0),
	m_level(0), m_scene(0) {}